

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int x509_parse_int(uchar **p,size_t n,int *res)

{
  byte *pbVar1;
  int *res_local;
  size_t n_local;
  uchar **p_local;
  
  *res = 0;
  res_local = (int *)n;
  while( true ) {
    if (res_local == (int *)0x0) {
      return 0;
    }
    if ((**p < 0x30) || (0x39 < **p)) break;
    *res = *res * 10;
    pbVar1 = *p;
    *p = pbVar1 + 1;
    *res = (*pbVar1 - 0x30) + *res;
    res_local = (int *)((long)res_local + -1);
  }
  return -0x2400;
}

Assistant:

static int x509_parse_int( unsigned char **p, size_t n, int *res )
{
    *res = 0;

    for( ; n > 0; --n )
    {
        if( ( **p < '0') || ( **p > '9' ) )
            return ( MBEDTLS_ERR_X509_INVALID_DATE );

        *res *= 10;
        *res += ( *(*p)++ - '0' );
    }

    return( 0 );
}